

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_throw(lua_State *L,int errcode)

{
  lua_longjmp *plVar1;
  global_State *pgVar2;
  lua_State *plVar3;
  StkId pTVar4;
  StkId pTVar5;
  int iVar6;
  undefined4 uVar7;
  
  plVar1 = L->errorJmp;
  if (plVar1 != (lua_longjmp *)0x0) {
    plVar1->status = errcode;
    longjmp((__jmp_buf_tag *)plVar1->b,1);
  }
  pgVar2 = L->l_G;
  L->status = (lu_byte)errcode;
  plVar3 = pgVar2->mainthread;
  if (plVar3->errorJmp == (lua_longjmp *)0x0) {
    if (pgVar2->panic != (lua_CFunction)0x0) {
      seterrorobj(L,errcode,L->top);
      if (L->ci->top < L->top) {
        L->ci->top = L->top;
      }
      (*pgVar2->panic)(L);
    }
    abort();
  }
  pTVar4 = plVar3->top;
  plVar3->top = pTVar4 + 1;
  pTVar5 = L->top;
  iVar6 = pTVar5[-1].tt_;
  uVar7 = *(undefined4 *)&pTVar5[-1].field_0xc;
  pTVar4->value_ = pTVar5[-1].value_;
  pTVar4->tt_ = iVar6;
  *(undefined4 *)&pTVar4->field_0xc = uVar7;
  luaD_throw(pgVar2->mainthread,errcode);
}

Assistant:

l_noret luaD_throw(lua_State *L, int errcode) {
    if (L->errorJmp) {  /* thread has an error handler? */
        L->errorJmp->status = errcode;  /* set status */
        LUAI_THROW(L, L->errorJmp);  /* jump to it */
    } else {  /* thread has no error handler */
        global_State *g = G(L);
        L->status = cast_byte(errcode);  /* mark it as dead */
        if (g->mainthread->errorJmp) {  /* main thread has a handler? */
            setobjs2s(L, g->mainthread->top++, L->top - 1);  /* copy error obj. */
            luaD_throw(g->mainthread, errcode);  /* re-throw in main thread */
        } else {  /* no handler at all; abort */
            if (g->panic) {  /* panic function? */
                seterrorobj(L, errcode, L->top);  /* assume EXTRA_STACK */
                if (L->ci->top < L->top)
                    L->ci->top = L->top;  /* pushing msg. can break this invariant */
                lua_unlock(L);
                g->panic(L);  /* call panic function (last chance to jump out) */
            }
            abort();
        }
    }
}